

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathCacheObjectCopy(xmlXPathContextPtr ctxt,xmlXPathObjectPtr val)

{
  xmlNodeSetPtr val_00;
  xmlXPathObjectPtr val_local;
  xmlXPathContextPtr ctxt_local;
  
  if (val == (xmlXPathObjectPtr)0x0) {
    return (xmlXPathObjectPtr)0x0;
  }
  if ((ctxt == (xmlXPathContextPtr)0x0) || (ctxt->cache == (void *)0x0)) {
switchD_0025901a_default:
    ctxt_local = (xmlXPathContextPtr)xmlXPathObjectCopy(val);
  }
  else {
    switch(val->type) {
    case XPATH_NODESET:
      val_00 = xmlXPathNodeSetMerge((xmlNodeSetPtr)0x0,val->nodesetval);
      ctxt_local = (xmlXPathContextPtr)xmlXPathCacheWrapNodeSet(ctxt,val_00);
      break;
    case XPATH_BOOLEAN:
      ctxt_local = (xmlXPathContextPtr)xmlXPathCacheNewBoolean(ctxt,val->boolval);
      break;
    case XPATH_NUMBER:
      ctxt_local = (xmlXPathContextPtr)xmlXPathCacheNewFloat(ctxt,val->floatval);
      break;
    case XPATH_STRING:
      ctxt_local = (xmlXPathContextPtr)xmlXPathCacheNewString(ctxt,val->stringval);
      break;
    default:
      goto switchD_0025901a_default;
    }
  }
  return (xmlXPathObjectPtr)ctxt_local;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheObjectCopy(xmlXPathContextPtr ctxt, xmlXPathObjectPtr val)
{
    if (val == NULL)
	return(NULL);

    if (XP_HAS_CACHE(ctxt)) {
	switch (val->type) {
	    case XPATH_NODESET:
		return(xmlXPathCacheWrapNodeSet(ctxt,
		    xmlXPathNodeSetMerge(NULL, val->nodesetval)));
	    case XPATH_STRING:
		return(xmlXPathCacheNewString(ctxt, val->stringval));
	    case XPATH_BOOLEAN:
		return(xmlXPathCacheNewBoolean(ctxt, val->boolval));
	    case XPATH_NUMBER:
		return(xmlXPathCacheNewFloat(ctxt, val->floatval));
	    default:
		break;
	}
    }
    return(xmlXPathObjectCopy(val));
}